

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O1

SnapShot * __thiscall TTD::SnapshotExtractor::CompleteSnapshot(SnapshotExtractor *this)

{
  double dVar1;
  double dVar2;
  SnapShot *pSVar3;
  
  pSVar3 = this->m_pendingSnap;
  UnloadDataFromExtractor(this);
  this->m_snapshotsTakenCount = this->m_snapshotsTakenCount + 1;
  dVar1 = pSVar3->MarkTime;
  this->m_totalMarkMillis = this->m_totalMarkMillis + dVar1;
  dVar2 = pSVar3->ExtractTime;
  this->m_totalExtractMillis = this->m_totalExtractMillis + dVar2;
  if (this->m_maxMarkMillis <= dVar1 && dVar1 != this->m_maxMarkMillis) {
    this->m_maxMarkMillis = dVar1;
  }
  if (this->m_maxExtractMillis <= dVar2 && dVar2 != this->m_maxExtractMillis) {
    this->m_maxExtractMillis = dVar2;
  }
  this->m_lastMarkMillis = dVar1;
  this->m_lastExtractMillis = dVar2;
  return pSVar3;
}

Assistant:

SnapShot* SnapshotExtractor::CompleteSnapshot()
    {
        SnapShot* snap = this->m_pendingSnap;
        this->UnloadDataFromExtractor();

        this->m_snapshotsTakenCount++;
        this->m_totalMarkMillis += snap->MarkTime;
        this->m_totalExtractMillis += snap->ExtractTime;

        if(this->m_maxMarkMillis < snap->MarkTime)
        {
            this->m_maxMarkMillis = snap->MarkTime;
        }

        if(this->m_maxExtractMillis < snap->ExtractTime)
        {
            this->m_maxExtractMillis = snap->ExtractTime;
        }

        this->m_lastMarkMillis = snap->MarkTime;
        this->m_lastExtractMillis = snap->ExtractTime;

        return snap;
    }